

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall
ON_Internal_ExtrudedEdge::SetBothEdgeTags(ON_Internal_ExtrudedEdge *this,ON_SubDEdgeTag edge_tag)

{
  ON_Internal_ExtrudedVertex *this_00;
  undefined7 in_register_00000031;
  uint evi;
  long lVar1;
  
  if ((int)CONCAT71(in_register_00000031,edge_tag) == 2) {
    if (this->m_original_edge != (ON_SubDEdge *)0x0) {
      this->m_original_edge->m_edge_tag = Crease;
    }
    if (this->m_copied_edge != (ON_SubDEdge *)0x0) {
      this->m_copied_edge->m_edge_tag = Crease;
    }
    for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
      this_00 = this->m_extruded_vertex[lVar1];
      if ((this_00 != (ON_Internal_ExtrudedVertex *)0x0) &&
         (this_00->m_connecting_edge->m_edge_tag == Unset)) {
        if (this_00->m_initial_vertex_tag == Corner) {
          ON_Internal_ExtrudedVertex::SetBothVertexTags(this_00,Corner);
        }
        else {
          this_00->m_connecting_edge->m_edge_tag = Smooth;
        }
      }
    }
  }
  return;
}

Assistant:

void SetBothEdgeTags(ON_SubDEdgeTag edge_tag)
  {
    if (ON_SubDEdgeTag::Crease == edge_tag)
    {
      if (nullptr != m_original_edge)
        m_original_edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      if (nullptr != m_copied_edge)
        m_copied_edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      for (unsigned evi = 0; evi < 2; ++evi)
      {
        if (nullptr != m_extruded_vertex[evi] && ON_SubDEdgeTag::Unset == m_extruded_vertex[evi]->m_connecting_edge->m_edge_tag)
        {
          if (ON_SubDVertexTag::Corner == m_extruded_vertex[evi]->m_initial_vertex_tag)
            m_extruded_vertex[evi]->SetBothVertexTags(ON_SubDVertexTag::Corner);
          else if (nullptr != m_extruded_vertex[evi]->m_connecting_edge)
            m_extruded_vertex[evi]->m_connecting_edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        }
      }
    }
  }